

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall
kratos::FSMState::output
          (FSMState *this,shared_ptr<kratos::Var> *output_var,shared_ptr<kratos::Var> *value_var)

{
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *this_00;
  iterator iVar1;
  VarException *this_01;
  mapped_type *ppVVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  initializer_list<const_kratos::IRNode_*> __l;
  string_view format_str;
  format_args args;
  string local_80;
  mapped_type local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  element_type *local_38;
  element_type *value;
  element_type *output;
  
  value = (output_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (value_var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &this->output_values_;
  iVar1 = std::
          _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
          ::find(&this_00->_M_t,&value);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->output_values_)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&this->output_ordering_,&value);
    std::
    _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Var*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
    ::_M_emplace_unique<kratos::Var*&,kratos::Var*&>
              ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Var*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
                *)this_00,&value,&local_38);
    return;
  }
  this_01 = (VarException *)__cxa_allocate_exception(0x10);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already has specified output");
  format_str.data_ = bVar3.size_;
  format_str.size_ = 0;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_80,(detail *)bVar3.data_,format_str,args);
  ppVVar2 = std::
            map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
            ::at(this_00,&value);
  local_60 = *ppVVar2;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_58,__l,(allocator_type *)((long)&output + 7));
  VarException::VarException(this_01,&local_80,&local_58);
  __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FSMState::output(const std::shared_ptr<Var>& output_var,
                      const std::shared_ptr<Var>& value_var) {
    auto* output = output_var.get();
    auto* value = value_var.get();
    if (output_values_.find(output) != output_values_.end()) {
        throw VarException(::format("{0} already has specified output"),
                           {output_values_.at(output)});
    }
    output_ordering_.emplace_back(output);
    output_values_.emplace(output, value);
}